

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O3

bool vkt::SpirVAssembly::compareFloats
               (vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                *param_1,
               vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
               *outputAllocs,
               vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
               *expectedOutputs,TestLog *log)

{
  ostringstream *this;
  void *pvVar1;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  float actual;
  float expected;
  float local_1c0;
  float local_1bc;
  TestLog *local_1b8;
  undefined1 local_1b0 [384];
  
  if ((outputAllocs->
      super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (outputAllocs->
      super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    lVar3 = 0;
    uVar4 = 0;
    local_1b8 = log;
    do {
      pvVar1 = (void *)(**(code **)(**(long **)((long)&((expectedOutputs->
                                                                                                                
                                                  super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->m_ptr
                                               + lVar3) + 0x18))();
      sVar2 = (**(code **)(**(long **)((long)&((expectedOutputs->
                                               super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start)->m_ptr +
                                      lVar3) + 0x10))();
      memcpy(&local_1bc,pvVar1,sVar2);
      pvVar1 = *(void **)(*(long *)((long)&((outputAllocs->
                                            super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start)->m_ptr +
                                   lVar3) + 0x18);
      sVar2 = (**(code **)(**(long **)((long)&((expectedOutputs->
                                               super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start)->m_ptr +
                                      lVar3) + 0x10))();
      memcpy(&local_1c0,pvVar1,sVar2);
      if (1e-05 < ABS(local_1bc - local_1c0)) {
        this = (ostringstream *)(local_1b0 + 8);
        local_1b0._0_8_ = local_1b8;
        std::__cxx11::ostringstream::ostringstream(this);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this,"Error: The actual and expected values not matching.",0x33);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," Expected: ",0xb);
        std::ostream::_M_insert<double>((double)local_1bc);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," Actual: ",9);
        std::ostream::_M_insert<double>((double)local_1c0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," Epsilon: ",10);
        std::ostream::_M_insert<double>(9.999999747378752e-06);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this);
        std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
        return false;
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x10;
    } while (uVar4 < (ulong)((long)(outputAllocs->
                                   super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(outputAllocs->
                                   super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  return true;
}

Assistant:

bool compareFloats (const std::vector<BufferSp>&, const vector<AllocationSp>& outputAllocs, const std::vector<BufferSp>& expectedOutputs, TestLog& log)
{
	DE_ASSERT(outputAllocs.size() != 0);
	DE_ASSERT(outputAllocs.size() == expectedOutputs.size());

	// Use custom epsilon because of the float->string conversion
	const float	epsilon	= 0.00001f;

	for (size_t outputNdx = 0; outputNdx < outputAllocs.size(); ++outputNdx)
	{
		float expected;
		memcpy(&expected, expectedOutputs[outputNdx]->data(), expectedOutputs[outputNdx]->getNumBytes());

		float actual;
		memcpy(&actual, outputAllocs[outputNdx]->getHostPtr(), expectedOutputs[outputNdx]->getNumBytes());

		// Test with epsilon
		if (fabs(expected - actual) > epsilon)
		{
			log << TestLog::Message << "Error: The actual and expected values not matching."
				<< " Expected: " << expected << " Actual: " << actual << " Epsilon: " << epsilon << TestLog::EndMessage;
			return false;
		}
	}
	return true;
}